

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O1

TestBuilder * __thiscall anon_unknown.dwarf_15bc091::TestBuilder::PushWitRedeem(TestBuilder *this)

{
  uint uVar1;
  iterator __first;
  long in_FS_OFFSET;
  allocator_type local_31;
  void *local_30 [2];
  long local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (this->witscript).super_CScriptBase._size;
  if (uVar1 < 0x1d) {
    __first.ptr = (uchar *)&this->witscript;
  }
  else {
    __first.ptr = (uchar *)(this->witscript).super_CScriptBase._union.indirect_contents.indirect;
    uVar1 = uVar1 - 0x1d;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<prevector<28u,unsigned_char,unsigned_int,int>::iterator,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_30,__first,
             (iterator)(__first.ptr + (int)uVar1),&local_31);
  DoPush(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  if (local_30[0] != (void *)0x0) {
    operator_delete(local_30[0],local_20 - (long)local_30[0]);
  }
  AsWit(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

TestBuilder& PushWitRedeem()
    {
        DoPush(std::vector<unsigned char>(witscript.begin(), witscript.end()));
        return AsWit();
    }